

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O1

QPolygonF * QStyleHelper::calcLines(QPolygonF *__return_storage_ptr__,QStyleOptionSlider *dial)

{
  double *pdVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  pointer pQVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long in_FS_OFFSET;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  int iVar21;
  int iVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 local_58 [16];
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = ZEXT816(0);
  local_48 = 0;
  uVar2 = (dial->super_QStyleOptionComplex).super_QStyleOption.rect.x2;
  uVar4 = (dial->super_QStyleOptionComplex).super_QStyleOption.rect.y2;
  uVar3 = (dial->super_QStyleOptionComplex).super_QStyleOption.rect.x1;
  uVar5 = (dial->super_QStyleOptionComplex).super_QStyleOption.rect.y1;
  iVar21 = (uVar2 - uVar3) + 1;
  iVar22 = (uVar4 - uVar5) + 1;
  iVar9 = iVar22;
  if (iVar21 < iVar22) {
    iVar9 = iVar21;
  }
  iVar11 = 4;
  if (4 < iVar9 / 0xc) {
    iVar11 = iVar9 / 0xc;
  }
  iVar12 = iVar9 + 3;
  if (-1 < iVar9) {
    iVar12 = iVar9;
  }
  iVar7 = iVar12 >> 2;
  if (iVar11 < iVar12 >> 2) {
    iVar7 = iVar11;
  }
  iVar11 = dial->tickInterval;
  if (iVar11 == 0) {
    local_58 = ZEXT816(0);
    (__return_storage_ptr__->super_QList<QPointF>).d.d = (Data *)0x0;
    (__return_storage_ptr__->super_QList<QPointF>).d.ptr = (QPointF *)0x0;
  }
  else {
    uVar6 = dial->minimum;
    iVar12 = dial->maximum;
    uVar8 = (int)(~uVar6 + iVar12 + iVar11) / iVar11;
    if (0 < (int)uVar8) {
      if (1000 < (int)(iVar12 - uVar6) || iVar12 < (int)uVar6) {
        uVar8 = (iVar11 + 999) / iVar11;
      }
      QList<QPointF>::resize((QList<QPointF> *)local_58,(long)(int)(uVar8 * 2 + 2));
      if (-1 < (int)uVar8) {
        iVar9 = iVar9 / 2;
        dVar24 = (double)iVar9;
        dVar14 = (double)(iVar21 / 2) + 0.5;
        dVar18 = (double)(iVar22 / 2) + 0.5;
        dVar25 = (double)(iVar9 + -1);
        dVar26 = dVar25 - (double)(iVar7 / 2);
        dVar27 = (double)(iVar9 - iVar7);
        iVar9 = 0;
        iVar22 = 0;
        iVar21 = 0;
        lVar13 = 0;
        do {
          if (dial->dialWrapping == true) {
            dVar15 = ((double)iVar9 * -3.141592653589793) / (double)(int)uVar8 + 4.71238898038469;
          }
          else {
            dVar15 = (((double)iVar22 * -3.141592653589793) / (double)(int)uVar8 +
                     25.132741228718345) / 6.0;
          }
          dVar16 = sin(dVar15);
          dVar17 = cos(dVar15);
          dVar15 = dVar27;
          dVar23 = -dVar27;
          dVar19 = dVar24;
          dVar20 = -dVar24;
          if (lVar13 != 0) {
            if (iVar21 % (int)(dial->pageStep + (uint)(dial->pageStep == 0)) != 0) {
              dVar15 = dVar26;
              dVar23 = -dVar26;
              dVar19 = dVar25;
              dVar20 = -dVar25;
            }
          }
          pQVar10 = QList<QPointF>::data((QList<QPointF> *)local_58);
          pdVar1 = (double *)((long)&pQVar10->xp + lVar13);
          *pdVar1 = dVar15 * dVar17 + dVar14;
          pdVar1[1] = dVar23 * dVar16 + dVar18;
          pQVar10 = QList<QPointF>::data((QList<QPointF> *)local_58);
          pdVar1 = (double *)((long)&pQVar10[1].xp + lVar13);
          *pdVar1 = dVar17 * dVar19 + dVar14;
          pdVar1[1] = dVar16 * dVar20 + dVar18;
          lVar13 = lVar13 + 0x20;
          iVar21 = iVar21 + iVar11;
          iVar22 = iVar22 + 10;
          iVar9 = iVar9 + 2;
        } while ((ulong)uVar8 * 0x20 + 0x20 != lVar13);
      }
      QPolygonF::translated((QPointF *)__return_storage_ptr__);
      goto LAB_0035004a;
    }
    local_58 = (undefined1  [16])0x0;
    (__return_storage_ptr__->super_QList<QPointF>).d.d = (Data *)0x0;
    (__return_storage_ptr__->super_QList<QPointF>).d.ptr = (QPointF *)0x0;
  }
  local_48 = 0;
  (__return_storage_ptr__->super_QList<QPointF>).d.size = 0;
LAB_0035004a:
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF calcLines(const QStyleOptionSlider *dial)
{
    QPolygonF poly;
    int width = dial->rect.width();
    int height = dial->rect.height();
    qreal r = qMin(width, height) / 2;
    int bigLineSize = calcBigLineSize(int(r));

    qreal xc = width / 2 + 0.5;
    qreal yc = height / 2 + 0.5;
    const int ns = dial->tickInterval;
    if (!ns) // Invalid values may be set by Qt Widgets Designer.
        return poly;
    int notches = (dial->maximum + ns - 1 - dial->minimum) / ns;
    if (notches <= 0)
        return poly;
    if (dial->maximum < dial->minimum || dial->maximum - dial->minimum > 1000) {
        int maximum = dial->minimum + 1000;
        notches = (maximum + ns - 1 - dial->minimum) / ns;
    }

    poly.resize(2 + 2 * notches);
    int smallLineSize = bigLineSize / 2;
    for (int i = 0; i <= notches; ++i) {
        qreal angle = dial->dialWrapping ? Q_PI * 3 / 2 - i * 2 * Q_PI / notches
                  : (Q_PI * 8 - i * 10 * Q_PI / notches) / 6;
        qreal s = qSin(angle);
        qreal c = qCos(angle);
        if (i == 0 || (((ns * i) % (dial->pageStep ? dial->pageStep : 1)) == 0)) {
            poly[2 * i] = QPointF(xc + (r - bigLineSize) * c,
                                  yc - (r - bigLineSize) * s);
            poly[2 * i + 1] = QPointF(xc + r * c, yc - r * s);
        } else {
            poly[2 * i] = QPointF(xc + (r - 1 - smallLineSize) * c,
                                  yc - (r - 1 - smallLineSize) * s);
            poly[2 * i + 1] = QPointF(xc + (r - 1) * c, yc -(r - 1) * s);
        }
    }
    return poly.translated(dial->rect.topLeft());
}